

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaAreValuesEqual(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  xmlSchemaValType xVar1;
  int iVar2;
  xmlSchemaTypePtr pxVar3;
  xmlSchemaTypePtr pxVar4;
  xmlChar *str1;
  xmlChar *str2;
  xmlSchemaValPtr pxVar5;
  int ret;
  xmlSchemaTypePtr pty;
  xmlSchemaTypePtr ptx;
  xmlSchemaTypePtr ty;
  xmlSchemaTypePtr tx;
  xmlSchemaValPtr y_local;
  xmlSchemaValPtr x_local;
  
  tx = (xmlSchemaTypePtr)y;
  y_local = x;
  do {
    if (y_local == (xmlSchemaValPtr)0x0) {
      return 0;
    }
    xVar1 = xmlSchemaGetValType(y_local);
    pxVar3 = xmlSchemaGetBuiltInType(xVar1);
    xVar1 = xmlSchemaGetValType((xmlSchemaValPtr)tx);
    pxVar4 = xmlSchemaGetBuiltInType(xVar1);
    pxVar3 = xmlSchemaGetPrimitiveType(pxVar3);
    pxVar4 = xmlSchemaGetPrimitiveType(pxVar4);
    if (pxVar3 != pxVar4) {
      return 0;
    }
    if ((pxVar3->builtInType == 1) ||
       ((pxVar3->type == XML_SCHEMA_TYPE_BASIC && (pxVar3->builtInType == 0x2e)))) {
      str1 = xmlSchemaValueGetAsString(y_local);
      str2 = xmlSchemaValueGetAsString((xmlSchemaValPtr)tx);
      iVar2 = xmlStrEqual(str1,str2);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      iVar2 = xmlSchemaCompareValuesWhtsp
                        (y_local,XML_SCHEMA_WHITESPACE_PRESERVE,(xmlSchemaValPtr)tx,
                         XML_SCHEMA_WHITESPACE_PRESERVE);
      if (iVar2 == -2) {
        return -1;
      }
      if (iVar2 != 0) {
        return 0;
      }
    }
    y_local = xmlSchemaValueGetNext(y_local);
    if (y_local == (xmlSchemaValPtr)0x0) {
      pxVar5 = xmlSchemaValueGetNext((xmlSchemaValPtr)tx);
      if (pxVar5 != (xmlSchemaValPtr)0x0) {
        return 0;
      }
      return 1;
    }
    tx = (xmlSchemaTypePtr)xmlSchemaValueGetNext((xmlSchemaValPtr)tx);
  } while (tx != (xmlSchemaTypePtr)0x0);
  return 0;
}

Assistant:

static int
xmlSchemaAreValuesEqual(xmlSchemaValPtr x,
		       xmlSchemaValPtr y)
{
    xmlSchemaTypePtr tx, ty, ptx, pty;
    int ret;

    while (x != NULL) {
	/* Same types. */
	tx = xmlSchemaGetBuiltInType(xmlSchemaGetValType(x));
	ty = xmlSchemaGetBuiltInType(xmlSchemaGetValType(y));
	ptx = xmlSchemaGetPrimitiveType(tx);
	pty = xmlSchemaGetPrimitiveType(ty);
	/*
	* (1) if a datatype T' is `derived` by `restriction` from an
	* atomic datatype T then the `value space` of T' is a subset of
	* the `value space` of T. */
	/*
	* (2) if datatypes T' and T'' are `derived` by `restriction`
	* from a common atomic ancestor T then the `value space`s of T'
	* and T'' may overlap.
	*/
	if (ptx != pty)
	    return(0);
	/*
	* We assume computed values to be normalized, so do a fast
	* string comparison for string based types.
	*/
	if ((ptx->builtInType == XML_SCHEMAS_STRING) ||
	    WXS_IS_ANY_SIMPLE_TYPE(ptx)) {
	    if (! xmlStrEqual(
		xmlSchemaValueGetAsString(x),
		xmlSchemaValueGetAsString(y)))
		return (0);
	} else {
	    ret = xmlSchemaCompareValuesWhtsp(
		x, XML_SCHEMA_WHITESPACE_PRESERVE,
		y, XML_SCHEMA_WHITESPACE_PRESERVE);
	    if (ret == -2)
		return(-1);
	    if (ret != 0)
		return(0);
	}
	/*
	* Lists.
	*/
	x = xmlSchemaValueGetNext(x);
	if (x != NULL) {
	    y = xmlSchemaValueGetNext(y);
	    if (y == NULL)
		return (0);
	} else if (xmlSchemaValueGetNext(y) != NULL)
	    return (0);
	else
	    return (1);
    }
    return (0);
}